

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O3

S2Cap * __thiscall S2Cap::Union(S2Cap *__return_storage_ptr__,S2Cap *this,S2Cap *other)

{
  double dVar1;
  S1Angle SVar2;
  S1Angle SVar3;
  bool bVar4;
  S2Cap *pSVar5;
  S2Point *x;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  VType VVar10;
  double dVar11;
  S1Angle local_50;
  S2LogMessage local_48;
  S2Point local_38;
  
  dVar11 = (this->radius_).length2_;
  uVar6 = SUB84(dVar11,0);
  uVar7 = (undefined4)((ulong)dVar11 >> 0x20);
  do {
    pSVar5 = other;
    other = this;
    dVar1 = (double)CONCAT44(uVar7,uVar6);
    dVar11 = (pSVar5->radius_).length2_;
    uVar6 = SUB84(dVar11,0);
    uVar7 = (undefined4)((ulong)dVar11 >> 0x20);
    this = pSVar5;
  } while (dVar1 < dVar11);
  if (((dVar1 == 4.0) && (!NAN(dVar1))) || (dVar11 < 0.0)) {
    (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002bb758;
    uVar6 = *(undefined4 *)(other->center_).c_;
    uVar7 = *(undefined4 *)((long)(other->center_).c_ + 4);
    uVar8 = *(undefined4 *)((other->center_).c_ + 1);
    uVar9 = *(undefined4 *)((long)(other->center_).c_ + 0xc);
    VVar10 = (other->center_).c_[2];
    dVar11 = (other->radius_).length2_;
  }
  else {
    SVar2 = S1ChordAngle::ToAngle(&other->radius_);
    SVar3 = S1ChordAngle::ToAngle(&pSVar5->radius_);
    x = &other->center_;
    S1Angle::S1Angle(&local_50,x,&pSVar5->center_);
    if (SVar2.radians_ < SVar3.radians_ + local_50.radians_) {
      dVar11 = (SVar2.radians_ + local_50.radians_ + SVar3.radians_) * 0.5;
      S2::InterpolateAtDistance
                (&local_38,(S1Angle)(((local_50.radians_ - SVar2.radians_) + SVar3.radians_) * 0.5),
                 x,&pSVar5->center_);
      (__return_storage_ptr__->super_S2Region)._vptr_S2Region =
           (_func_int **)&PTR__S2Region_002bb758;
      (__return_storage_ptr__->center_).c_[0] = local_38.c_[0];
      (__return_storage_ptr__->center_).c_[1] = local_38.c_[1];
      (__return_storage_ptr__->center_).c_[2] = local_38.c_[2];
      SVar2.radians_ = 3.141592653589793;
      if (dVar11 <= 3.141592653589793) {
        SVar2.radians_ = dVar11;
      }
      S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,SVar2);
      bVar4 = S2::IsUnitLength(&__return_storage_ptr__->center_);
      if ((bVar4) && ((__return_storage_ptr__->radius_).length2_ <= 4.0)) {
        return __return_storage_ptr__;
      }
      S2LogMessage::S2LogMessage
                (&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
                 ,0xf0,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_48.stream_,"Check failed: is_valid() ",0x19);
      abort();
    }
    (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002bb758;
    uVar6 = *(undefined4 *)x->c_;
    uVar7 = *(undefined4 *)((long)(other->center_).c_ + 4);
    uVar8 = *(undefined4 *)((other->center_).c_ + 1);
    uVar9 = *(undefined4 *)((long)(other->center_).c_ + 0xc);
    VVar10 = (other->center_).c_[2];
    dVar11 = (other->radius_).length2_;
  }
  *(undefined4 *)(__return_storage_ptr__->center_).c_ = uVar6;
  *(undefined4 *)((long)(__return_storage_ptr__->center_).c_ + 4) = uVar7;
  *(undefined4 *)((__return_storage_ptr__->center_).c_ + 1) = uVar8;
  *(undefined4 *)((long)(__return_storage_ptr__->center_).c_ + 0xc) = uVar9;
  (__return_storage_ptr__->center_).c_[2] = VVar10;
  (__return_storage_ptr__->radius_).length2_ = dVar11;
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2Cap::Union(const S2Cap& other) const {
  if (radius_ < other.radius_) {
    return other.Union(*this);
  }
  if (is_full() || other.is_empty()) {
    return *this;
  }
  // This calculation would be more efficient using S1ChordAngles.
  S1Angle this_radius = GetRadius();
  S1Angle other_radius = other.GetRadius();
  S1Angle distance(center(), other.center());
  if (this_radius >= distance + other_radius) {
    return *this;
  } else {
    S1Angle result_radius = 0.5 * (distance + this_radius + other_radius);
    S2Point result_center = S2::InterpolateAtDistance(
        0.5 * (distance - this_radius + other_radius),
        center(),
        other.center());
    return S2Cap(result_center, result_radius);
  }
}